

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ConditionalStatementSyntax::ConditionalStatementSyntax
          (ConditionalStatementSyntax *this,NamedLabelSyntax *label,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token uniqueOrPriority,
          Token ifKeyword,Token openParen,ConditionalPredicateSyntax *predicate,Token closeParen,
          StatementSyntax *statement,ElseClauseSyntax *elseClause)

{
  Token TVar1;
  Token TVar2;
  Token TVar3;
  ConditionalPredicateSyntax *pCVar4;
  StatementSyntax *pSVar5;
  StatementSyntax *local_48;
  ConditionalPredicateSyntax *local_40;
  ConditionalPredicateSyntax *local_38;
  ConditionalPredicateSyntax *predicate_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  NamedLabelSyntax *label_local;
  ConditionalStatementSyntax *this_local;
  Token uniqueOrPriority_local;
  
  TVar3 = closeParen;
  TVar2 = openParen;
  TVar1 = ifKeyword;
  uniqueOrPriority_local._0_8_ = uniqueOrPriority.info;
  this_local = uniqueOrPriority._0_8_;
  local_38 = predicate;
  predicate_local = (ConditionalPredicateSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)label;
  label_local = (NamedLabelSyntax *)this;
  StatementSyntax::StatementSyntax
            (&this->super_StatementSyntax,ConditionalStatement,label,attributes);
  *(ConditionalStatementSyntax **)&this->uniqueOrPriority = this_local;
  (this->uniqueOrPriority).info = (Info *)uniqueOrPriority_local._0_8_;
  (this->ifKeyword).kind = ifKeyword.kind;
  (this->ifKeyword).field_0x2 = ifKeyword._2_1_;
  (this->ifKeyword).numFlags = (NumericTokenFlags)ifKeyword.numFlags.raw;
  (this->ifKeyword).rawLen = ifKeyword.rawLen;
  ifKeyword.info = TVar1.info;
  (this->ifKeyword).info = ifKeyword.info;
  (this->openParen).kind = openParen.kind;
  (this->openParen).field_0x2 = openParen._2_1_;
  (this->openParen).numFlags = (NumericTokenFlags)openParen.numFlags.raw;
  (this->openParen).rawLen = openParen.rawLen;
  openParen.info = TVar2.info;
  (this->openParen).info = openParen.info;
  local_40 = local_38;
  not_null<slang::syntax::ConditionalPredicateSyntax*>::
  not_null<slang::syntax::ConditionalPredicateSyntax*,void>
            ((not_null<slang::syntax::ConditionalPredicateSyntax*> *)&this->predicate,&local_40);
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  closeParen.info = TVar3.info;
  (this->closeParen).info = closeParen.info;
  local_48 = statement;
  not_null<slang::syntax::StatementSyntax*>::not_null<slang::syntax::StatementSyntax*,void>
            ((not_null<slang::syntax::StatementSyntax*> *)&this->statement,&local_48);
  this->elseClause = elseClause;
  pCVar4 = not_null<slang::syntax::ConditionalPredicateSyntax_*>::operator->(&this->predicate);
  (pCVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  pSVar5 = not_null<slang::syntax::StatementSyntax_*>::operator->(&this->statement);
  (pSVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->elseClause != (ElseClauseSyntax *)0x0) {
    (this->elseClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ConditionalStatementSyntax(NamedLabelSyntax* label, const SyntaxList<AttributeInstanceSyntax>& attributes, Token uniqueOrPriority, Token ifKeyword, Token openParen, ConditionalPredicateSyntax& predicate, Token closeParen, StatementSyntax& statement, ElseClauseSyntax* elseClause) :
        StatementSyntax(SyntaxKind::ConditionalStatement, label, attributes), uniqueOrPriority(uniqueOrPriority), ifKeyword(ifKeyword), openParen(openParen), predicate(&predicate), closeParen(closeParen), statement(&statement), elseClause(elseClause) {
        this->predicate->parent = this;
        this->statement->parent = this;
        if (this->elseClause) this->elseClause->parent = this;
    }